

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_init_userdefined(Curl_easy *data)

{
  int iVar1;
  CURLcode local_24;
  CURLcode result;
  UserDefined *set;
  Curl_easy *data_local;
  
  local_24 = CURLE_OK;
  (data->set).out = _stdout;
  (data->set).in_set = _stdin;
  (data->set).err = _stderr;
  (data->set).fwrite_func = fwrite;
  (data->set).fread_func_set = fread;
  *(ulong *)&(data->set).field_0x888 = *(ulong *)&(data->set).field_0x888 & 0xfffffffffffffffe;
  *(ulong *)&(data->set).field_0x888 = *(ulong *)&(data->set).field_0x888 & 0xfffffffffffffffd;
  (data->set).seek_func = (curl_seek_callback)0x0;
  (data->set).seek_client = (void *)0x0;
  (data->set).convfromnetwork = (curl_conv_callback)0x0;
  (data->set).convtonetwork = (curl_conv_callback)0x0;
  (data->set).convfromutf8 = (curl_conv_callback)0x0;
  (data->set).filesize = -1;
  (data->set).postfieldsize = -1;
  (data->set).maxredirs = -1;
  (data->set).httpreq = HTTPREQ_GET;
  (data->set).rtspreq = RTSPREQ_OPTIONS;
  *(ulong *)&(data->set).field_0x888 =
       *(ulong *)&(data->set).field_0x888 & 0xffffffffffff7fff | 0x8000;
  *(ulong *)&(data->set).field_0x888 =
       *(ulong *)&(data->set).field_0x888 & 0xfffffffffffeffff | 0x10000;
  *(ulong *)&(data->set).field_0x888 = *(ulong *)&(data->set).field_0x888 & 0xfffffffffffdffff;
  (data->set).ftp_filemethod = FTPFILE_MULTICWD;
  (data->set).dns_cache_timeout = 0x3c;
  (data->set).general_ssl.max_ssl_sessions = 5;
  (data->set).proxyport = 0;
  (data->set).proxytype = CURLPROXY_HTTP;
  (data->set).httpauth = 1;
  (data->set).proxyauth = 1;
  (data->set).socks5auth = 5;
  *(ulong *)&(data->set).field_0x888 =
       *(ulong *)&(data->set).field_0x888 & 0xfffffffffff7ffff | 0x80000;
  Curl_mime_initpart(&(data->set).mimepost,data);
  (data->set).ssl.primary.field_0x48 = (data->set).ssl.primary.field_0x48 & 0xfe | 1;
  (data->set).ssl.primary.field_0x48 = (data->set).ssl.primary.field_0x48 & 0xfd | 2;
  (data->set).ssh_auth_types = -1;
  (data->set).ssl.primary.field_0x48 = (data->set).ssl.primary.field_0x48 & 0xf7 | 8;
  memcpy(&(data->set).proxy_ssl,&(data->set).ssl,0xa8);
  (data->set).new_file_perms = 0x1a4;
  (data->set).new_directory_perms = 0x1ed;
  (data->set).allowed_protocols = -1;
  (data->set).redir_protocols = -0xc000411;
  iVar1 = Curl_ssl_backend();
  if ((iVar1 == 8) ||
     ((((data_local._4_4_ =
              Curl_setstropt((data->set).str + 0x1c,"/etc/ssl/certs/ca-certificates.crt"),
        data_local._4_4_ == CURLE_OK &&
        (data_local._4_4_ =
              Curl_setstropt((data->set).str + 0x1d,"/etc/ssl/certs/ca-certificates.crt"),
        data_local._4_4_ == CURLE_OK)) &&
       (data_local._4_4_ = Curl_setstropt((data->set).str + 0x1a,"/etc/ssl/certs"),
       data_local._4_4_ == CURLE_OK)) &&
      (local_24 = Curl_setstropt((data->set).str + 0x1b,"/etc/ssl/certs"),
      data_local._4_4_ = local_24, local_24 == CURLE_OK)))) {
    *(ulong *)&(data->set).field_0x888 = *(ulong *)&(data->set).field_0x888 & 0xfffffbffffffffff;
    (data->set).chunk_bgn = (curl_chunk_bgn_callback)0x0;
    (data->set).chunk_end = (curl_chunk_end_callback)0x0;
    *(ulong *)&(data->set).field_0x888 = *(ulong *)&(data->set).field_0x888 & 0xfffff7ffffffffff;
    (data->set).tcp_keepintvl = 0x3c;
    (data->set).tcp_keepidle = 0x3c;
    *(ulong *)&(data->set).field_0x888 = *(ulong *)&(data->set).field_0x888 & 0xffffefffffffffff;
    *(ulong *)&(data->set).field_0x888 =
         *(ulong *)&(data->set).field_0x888 & 0xfffffff7ffffffff | 0x800000000;
    *(ulong *)&(data->set).field_0x888 =
         *(ulong *)&(data->set).field_0x888 & 0xffffdfffffffffff | 0x200000000000;
    *(ulong *)&(data->set).field_0x888 =
         *(ulong *)&(data->set).field_0x888 & 0xffffbfffffffffff | 0x400000000000;
    (data->set).expect_100_timeout = 1000;
    *(ulong *)&(data->set).field_0x888 =
         *(ulong *)&(data->set).field_0x888 & 0xffffffffffffffef | 0x10;
    (data->set).buffer_size = 0x4000;
    (data->set).upload_buffer_size = 0x10000;
    (data->set).happy_eyeballs_timeout = 200;
    (data->set).fnmatch = (curl_fnmatch_callback)0x0;
    (data->set).upkeep_interval_ms = 60000;
    (data->set).maxconnects = 5;
    (data->set).maxage_conn = 0x76;
    *(ulong *)&(data->set).field_0x888 =
         *(ulong *)&(data->set).field_0x888 & 0xfdffffffffffffff | 0x200000000000000;
    (data->set).httpversion = 2;
    data_local._4_4_ = local_24;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_init_userdefined(struct Curl_easy *data)
{
  struct UserDefined *set = &data->set;
  CURLcode result = CURLE_OK;

  set->out = stdout; /* default output to stdout */
  set->in_set = stdin;  /* default input from stdin */
  set->err  = stderr;  /* default stderr to stderr */

  /* use fwrite as default function to store output */
  set->fwrite_func = (curl_write_callback)fwrite;

  /* use fread as default function to read input */
  set->fread_func_set = (curl_read_callback)fread;
  set->is_fread_set = 0;
  set->is_fwrite_set = 0;

  set->seek_func = ZERO_NULL;
  set->seek_client = ZERO_NULL;

  /* conversion callbacks for non-ASCII hosts */
  set->convfromnetwork = ZERO_NULL;
  set->convtonetwork   = ZERO_NULL;
  set->convfromutf8    = ZERO_NULL;

  set->filesize = -1;        /* we don't know the size */
  set->postfieldsize = -1;   /* unknown size */
  set->maxredirs = -1;       /* allow any amount by default */

  set->httpreq = HTTPREQ_GET; /* Default HTTP request */
  set->rtspreq = RTSPREQ_OPTIONS; /* Default RTSP request */
#ifndef CURL_DISABLE_FTP
  set->ftp_use_epsv = TRUE;   /* FTP defaults to EPSV operations */
  set->ftp_use_eprt = TRUE;   /* FTP defaults to EPRT operations */
  set->ftp_use_pret = FALSE;  /* mainly useful for drftpd servers */
  set->ftp_filemethod = FTPFILE_MULTICWD;
#endif
  set->dns_cache_timeout = 60; /* Timeout every 60 seconds by default */

  /* Set the default size of the SSL session ID cache */
  set->general_ssl.max_ssl_sessions = 5;

  set->proxyport = 0;
  set->proxytype = CURLPROXY_HTTP; /* defaults to HTTP proxy */
  set->httpauth = CURLAUTH_BASIC;  /* defaults to basic */
  set->proxyauth = CURLAUTH_BASIC; /* defaults to basic */

  /* SOCKS5 proxy auth defaults to username/password + GSS-API */
  set->socks5auth = CURLAUTH_BASIC | CURLAUTH_GSSAPI;

  /* make libcurl quiet by default: */
  set->hide_progress = TRUE;  /* CURLOPT_NOPROGRESS changes these */

  Curl_mime_initpart(&set->mimepost, data);

  /*
   * libcurl 7.10 introduced SSL verification *by default*! This needs to be
   * switched off unless wanted.
   */
  set->ssl.primary.verifypeer = TRUE;
  set->ssl.primary.verifyhost = TRUE;
#ifdef USE_TLS_SRP
  set->ssl.authtype = CURL_TLSAUTH_NONE;
#endif
  set->ssh_auth_types = CURLSSH_AUTH_DEFAULT; /* defaults to any auth
                                                      type */
  set->ssl.primary.sessionid = TRUE; /* session ID caching enabled by
                                        default */
  set->proxy_ssl = set->ssl;

  set->new_file_perms = 0644;    /* Default permissions */
  set->new_directory_perms = 0755; /* Default permissions */

  /* for the *protocols fields we don't use the CURLPROTO_ALL convenience
     define since we internally only use the lower 16 bits for the passed
     in bitmask to not conflict with the private bits */
  set->allowed_protocols = CURLPROTO_ALL;
  set->redir_protocols = CURLPROTO_ALL &  /* All except FILE, SCP and SMB */
                          ~(CURLPROTO_FILE | CURLPROTO_SCP | CURLPROTO_SMB |
                            CURLPROTO_SMBS);

#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  /*
   * disallow unprotected protection negotiation NEC reference implementation
   * seem not to follow rfc1961 section 4.3/4.4
   */
  set->socks5_gssapi_nec = FALSE;
#endif

  /* Set the default CA cert bundle/path detected/specified at build time.
   *
   * If Schannel is the selected SSL backend then these locations are
   * ignored. We allow setting CA location for schannel only when explicitly
   * specified by the user via CURLOPT_CAINFO / --cacert.
   */
  if(Curl_ssl_backend() != CURLSSLBACKEND_SCHANNEL) {
#if defined(CURL_CA_BUNDLE)
    result = Curl_setstropt(&set->str[STRING_SSL_CAFILE_ORIG], CURL_CA_BUNDLE);
    if(result)
      return result;

    result = Curl_setstropt(&set->str[STRING_SSL_CAFILE_PROXY],
                            CURL_CA_BUNDLE);
    if(result)
      return result;
#endif
#if defined(CURL_CA_PATH)
    result = Curl_setstropt(&set->str[STRING_SSL_CAPATH_ORIG], CURL_CA_PATH);
    if(result)
      return result;

    result = Curl_setstropt(&set->str[STRING_SSL_CAPATH_PROXY], CURL_CA_PATH);
    if(result)
      return result;
#endif
  }

  set->wildcard_enabled = FALSE;
  set->chunk_bgn      = ZERO_NULL;
  set->chunk_end      = ZERO_NULL;
  set->tcp_keepalive = FALSE;
  set->tcp_keepintvl = 60;
  set->tcp_keepidle = 60;
  set->tcp_fastopen = FALSE;
  set->tcp_nodelay = TRUE;
  set->ssl_enable_npn = TRUE;
  set->ssl_enable_alpn = TRUE;
  set->expect_100_timeout = 1000L; /* Wait for a second by default. */
  set->sep_headers = TRUE; /* separated header lists by default */
  set->buffer_size = READBUFFER_SIZE;
  set->upload_buffer_size = UPLOADBUFFER_DEFAULT;
  set->happy_eyeballs_timeout = CURL_HET_DEFAULT;
  set->fnmatch = ZERO_NULL;
  set->upkeep_interval_ms = CURL_UPKEEP_INTERVAL_DEFAULT;
  set->maxconnects = DEFAULT_CONNCACHE_SIZE; /* for easy handles */
  set->maxage_conn = 118;
  set->http09_allowed = TRUE;
  set->httpversion =
#ifdef USE_NGHTTP2
    CURL_HTTP_VERSION_2TLS
#else
    CURL_HTTP_VERSION_1_1
#endif
    ;
  Curl_http2_init_userset(set);
  return result;
}